

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

ssize_t base64_decode_using_maps
                  (base64_maps_t *maps,char *dest,size_t destlen,char *src,size_t srclen)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  char *src_00;
  long lVar5;
  
  if (destlen < (srclen + 3 >> 2) * 3) {
    piVar3 = __errno_location();
    *piVar3 = 0x4b;
  }
  else {
    if (srclen < 5) {
      lVar5 = 0;
      lVar4 = 0;
    }
    else {
      lVar4 = 0;
      lVar5 = 0;
      src_00 = src;
      do {
        iVar2 = base64_decode_quartet_using_maps(maps,dest + lVar5,src_00);
        if (iVar2 == -1) {
          return -1;
        }
        lVar5 = lVar5 + 3;
        src_00 = src_00 + 4;
        lVar1 = srclen + lVar4;
        lVar4 = lVar4 + -4;
      } while (4 < lVar1 - 4U);
      srclen = srclen + lVar4;
      lVar4 = -lVar4;
    }
    iVar2 = base64_decode_tail_using_maps(maps,dest + lVar5,src + lVar4,srclen);
    if (iVar2 != -1) {
      lVar5 = lVar5 + iVar2;
      memset(dest + lVar5,0,destlen - lVar5);
      return lVar5;
    }
  }
  return -1;
}

Assistant:

ssize_t base64_decode_using_maps(const base64_maps_t *maps,
				 char *dest, const size_t destlen,
				 const char *src, const size_t srclen)
{
	ssize_t dest_offset = 0;
	ssize_t i;
	size_t more;

	if (destlen < base64_decoded_length(srclen)) {
		errno = EOVERFLOW;
		return -1;
	}

	for(i=0; srclen - i > 4; i+=4) {
		if (base64_decode_quartet_using_maps(maps, &dest[dest_offset], &src[i]) == -1) {
			return -1;
		}
		dest_offset += 3;
	}

	more = base64_decode_tail_using_maps(maps, &dest[dest_offset], &src[i], srclen - i);
	if (more == -1) {
		return -1;
	}
	dest_offset += more;

	memset(&dest[dest_offset], '\0', destlen-dest_offset);

	return dest_offset;
}